

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void anon_unknown.dwarf_ec2bc::ReadChannelInfo
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *channels,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  int *piVar1;
  ChannelInfo info;
  value_type local_50;
  
  piVar1 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
  for (; (value_type)*piVar1 != '\0'; piVar1 = piVar1 + 4) {
    local_50.name._M_string_length = 0;
    local_50.name.field_2._M_local_buf[0] = '\0';
    local_50.name._M_dataplus._M_p = (pointer)&local_50.name.field_2;
    piVar1 = (int *)ReadString(&local_50.name,(char *)piVar1);
    local_50.pixelType = *piVar1;
    local_50.pLinear = (uchar)piVar1[1];
    local_50.xSampling = piVar1[2];
    local_50.ySampling = piVar1[3];
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::push_back(channels,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ReadChannelInfo(std::vector<ChannelInfo> &channels,
                     const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;
    p = ReadString(info.name, p);

    memcpy(&info.pixelType, p, sizeof(int));
    p += 4;
    info.pLinear = p[0];                     // uchar
    p += 1 + 3;                              // reserved: uchar[3]
    memcpy(&info.xSampling, p, sizeof(int)); // int
    p += 4;
    memcpy(&info.ySampling, p, sizeof(int)); // int
    p += 4;

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&info.pixelType));
      swap4(reinterpret_cast<unsigned int *>(&info.xSampling));
      swap4(reinterpret_cast<unsigned int *>(&info.ySampling));
    }

    channels.push_back(info);
  }
}